

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * gtemplate_donew(t_symbol *sym,int argc,t_atom *argv)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  _gtemplate *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  _gtemplate *owner;
  t_template *ptVar8;
  _glist *p_Var9;
  t_atom *ptVar10;
  long lVar11;
  _gtemplate *p_Var12;
  t_template *x2;
  ulong uVar13;
  
  owner = (_gtemplate *)pd_new(gtemplate_class);
  ptVar8 = template_findbyname(sym);
  gensym("x");
  p_Var9 = canvas_getcurrent();
  owner->x_owner = p_Var9;
  owner->x_next = (_gtemplate *)0x0;
  owner->x_sym = sym;
  owner->x_argc = argc;
  ptVar10 = (t_atom *)getbytes((long)argc << 4);
  owner->x_argv = ptVar10;
  lVar11 = 0;
  uVar13 = 0;
  if (0 < argc) {
    uVar13 = (ulong)(uint)argc;
  }
  for (; uVar13 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
    puVar1 = (undefined4 *)((long)&argv->a_type + lVar11);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)((long)&owner->x_argv->a_type + lVar11);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = uVar5;
    puVar2[3] = uVar6;
  }
  if (ptVar8 == (t_template *)0x0) {
    ptVar8 = template_new(sym,argc,argv);
    owner->x_template = ptVar8;
    ptVar8->t_list = owner;
  }
  else {
    owner->x_template = ptVar8;
    p_Var3 = ptVar8->t_list;
    if (ptVar8->t_list == (_gtemplate *)0x0) {
      x2 = template_new(&s_,argc,argv);
      canvas_redrawallfortemplate(ptVar8,2);
      iVar7 = template_match(ptVar8,x2);
      if (iVar7 == 0) {
        template_conform(ptVar8,x2);
        pd_free(&ptVar8->t_pdobj);
        ptVar8 = template_new(sym,argc,argv);
        owner->x_template = ptVar8;
      }
      pd_free(&x2->t_pdobj);
      ptVar8->t_list = owner;
      canvas_redrawallfortemplate(ptVar8,1);
    }
    else {
      do {
        p_Var12 = p_Var3;
        p_Var3 = p_Var12->x_next;
      } while (p_Var3 != (_gtemplate *)0x0);
      p_Var12->x_next = owner;
      post("template %s: warning: already exists.");
    }
  }
  outlet_new((t_object *)owner,(t_symbol *)0x0);
  return owner;
}

Assistant:

static void *gtemplate_donew(t_symbol *sym, int argc, t_atom *argv)
{
    t_gtemplate *x = (t_gtemplate *)pd_new(gtemplate_class);
    t_template *t = template_findbyname(sym);
    int i;
    t_symbol *sx = gensym("x");
    x->x_owner = canvas_getcurrent();
    x->x_next = 0;
    x->x_sym = sym;
    x->x_argc = argc;
    x->x_argv = (t_atom *)getbytes(argc * sizeof(t_atom));
    for (i = 0; i < argc; i++)
        x->x_argv[i] = argv[i];

        /* already have a template by this name? */
    if (t)
    {
        x->x_template = t;
            /* if it's already got a "struct" object we
            just tack this one to the end of the list and leave it
            there. */
        if (t->t_list)
        {
            t_gtemplate *x2, *x3;
            for (x2 = x->x_template->t_list; (x3 = x2->x_next); x2 = x3)
                ;
            x2->x_next = x;
            post("template %s: warning: already exists.", sym->s_name);
        }
        else
        {
                /* if there's none, we just replace the template with
                our own and conform it. */
            t_template *y = template_new(&s_, argc, argv);
            canvas_redrawallfortemplate(t, 2);
                /* Unless the new template is different from the old one,
                there's nothing to do.  */
            if (!template_match(t, y))
            {
                    /* conform everyone to the new template */
                template_conform(t, y);
                pd_free(&t->t_pdobj);
                x->x_template = t = template_new(sym, argc, argv);
            }
            pd_free(&y->t_pdobj);
            t->t_list = x;
            canvas_redrawallfortemplate(t, 1);
        }
    }
    else
    {
            /* otherwise make a new one and we're the only struct on it. */
        x->x_template = t = template_new(sym, argc, argv);
        t->t_list = x;
    }
    outlet_new(&x->x_obj, 0);
    return (x);
}